

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecordUsageCache.cpp
# Opt level: O0

PolymorphicInlineCache * __thiscall
Js::PropertyRecordUsageCache::CreateBiggerPolymorphicInlineCache
          (PropertyRecordUsageCache *this,bool isLdElem)

{
  code *pcVar1;
  bool bVar2;
  uint16 currentSize;
  uint16 size;
  int iVar3;
  PropertyId propertyId;
  undefined4 extraout_var;
  undefined4 *puVar4;
  JavascriptLibrary *javascriptLibrary;
  ScriptContextPolymorphicInlineCache *clone;
  PropertyRecord *this_00;
  char16 *pcVar5;
  PolymorphicInlineCache *local_48;
  PolymorphicInlineCache *newPolymorphicInlineCache;
  uint16 newPolymorphicInlineCacheSize;
  uint16 polymorphicInlineCacheSize;
  ScriptContext *scriptContext;
  PolymorphicInlineCache *polymorphicInlineCache;
  bool isLdElem_local;
  PropertyRecordUsageCache *this_local;
  
  if (isLdElem) {
    local_48 = GetLdElemInlineCache(this);
  }
  else {
    local_48 = GetStElemInlineCache(this);
  }
  iVar3 = (*(local_48->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[7])();
  if ((local_48 == (PolymorphicInlineCache *)0x0) ||
     (bVar2 = PolymorphicInlineCache::CanAllocateBigger(local_48), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/PropertyRecordUsageCache.cpp"
                                ,0x39,
                                "(polymorphicInlineCache && polymorphicInlineCache->CanAllocateBigger())"
                                ,
                                "polymorphicInlineCache && polymorphicInlineCache->CanAllocateBigger()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  currentSize = PolymorphicInlineCache::GetSize(local_48);
  size = PolymorphicInlineCache::GetNextSize(currentSize);
  if (size <= currentSize) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/PropertyRecordUsageCache.cpp"
                                ,0x3c,"(newPolymorphicInlineCacheSize > polymorphicInlineCacheSize)"
                                ,"newPolymorphicInlineCacheSize > polymorphicInlineCacheSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  javascriptLibrary = ScriptContext::GetLibrary((ScriptContext *)CONCAT44(extraout_var,iVar3));
  clone = ScriptContextPolymorphicInlineCache::New(size,javascriptLibrary);
  this_00 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->(&this->propertyRecord);
  propertyId = PropertyRecord::GetPropertyId(this_00);
  PolymorphicInlineCache::CopyTo
            (local_48,propertyId,(ScriptContext *)CONCAT44(extraout_var,iVar3),
             &clone->super_PolymorphicInlineCache);
  if (isLdElem) {
    Memory::WriteBarrierPtr<Js::PolymorphicInlineCache>::operator=
              (&this->ldElemInlineCache,&clone->super_PolymorphicInlineCache);
  }
  else {
    Memory::WriteBarrierPtr<Js::PolymorphicInlineCache>::operator=
              (&this->stElemInlineCache,&clone->super_PolymorphicInlineCache);
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,PolymorphicInlineCachePhase);
  if (((bVar2) && ((DAT_01ec73ca & 1) != 0)) ||
     (bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,PropertyCachePhase), bVar2)) {
    pcVar5 = GetString(this);
    Output::Print(L"PropertyRecordUsageCache \'%s\' : Bigger PIC, oldSize = %d, newSize = %d\n",
                  pcVar5,(ulong)currentSize,(ulong)size);
  }
  return &clone->super_PolymorphicInlineCache;
}

Assistant:

PolymorphicInlineCache * PropertyRecordUsageCache::CreateBiggerPolymorphicInlineCache(bool isLdElem)
    {
        PolymorphicInlineCache * polymorphicInlineCache = isLdElem ? GetLdElemInlineCache() : GetStElemInlineCache();
        ScriptContext * scriptContext = polymorphicInlineCache->GetScriptContext();
        Assert(polymorphicInlineCache && polymorphicInlineCache->CanAllocateBigger());
        uint16 polymorphicInlineCacheSize = polymorphicInlineCache->GetSize();
        uint16 newPolymorphicInlineCacheSize = PolymorphicInlineCache::GetNextSize(polymorphicInlineCacheSize);
        Assert(newPolymorphicInlineCacheSize > polymorphicInlineCacheSize);
        PolymorphicInlineCache * newPolymorphicInlineCache = ScriptContextPolymorphicInlineCache::New(newPolymorphicInlineCacheSize, scriptContext->GetLibrary());
        polymorphicInlineCache->CopyTo(this->propertyRecord->GetPropertyId(), scriptContext, newPolymorphicInlineCache);
        if (isLdElem)
        {
            this->ldElemInlineCache = newPolymorphicInlineCache;
        }
        else
        {
            this->stElemInlineCache = newPolymorphicInlineCache;
        }
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (PHASE_VERBOSE_TRACE1(Js::PolymorphicInlineCachePhase) || PHASE_TRACE1(PropertyCachePhase))
        {
            Output::Print(_u("PropertyRecordUsageCache '%s' : Bigger PIC, oldSize = %d, newSize = %d\n"), GetString(), polymorphicInlineCacheSize, newPolymorphicInlineCacheSize);
        }
#endif
        return newPolymorphicInlineCache;
    }